

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<(anonymous_namespace)::CMakeVersion> * __thiscall
cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::
Bind<(anonymous_namespace)::CMakeVersion,unsigned_int,std::function<bool(unsigned_int&,Json::Value_const*,cmJSONState*)>>
          (Object<(anonymous_namespace)::CMakeVersion> *this,string_view *name,
          offset_in_CMakeVersion_to_unsigned_int member,
          function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *func,bool required)

{
  Object<(anonymous_namespace)::CMakeVersion> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *pfStack_28;
  bool required_local;
  function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *func_local;
  offset_in_CMakeVersion_to_unsigned_int member_local;
  string_view *name_local;
  Object<(anonymous_namespace)::CMakeVersion> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)> *)member;
  member_local = (offset_in_CMakeVersion_to_unsigned_int)name;
  name_local = (string_view *)this;
  std::function<bool_(unsigned_int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            (&local_78.func,func);
  local_78.member = (offset_in_CMakeVersion_to_unsigned_int)func_local;
  std::function<bool((anonymous_namespace)::CMakeVersion&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Object<(anonymous_namespace)::CMakeVersion>::Bind<(anonymous_namespace)::CMakeVersion,unsigned_int,std::function<bool(unsigned_int&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,unsigned_int(anonymous_namespace)::CMakeVersion::*,std::function<bool(unsigned_int&,Json::Value_const*,cmJSONState*)>,bool)::_lambda((anonymous_namespace)::CMakeVersion&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool((anonymous_namespace)::CMakeVersion&,Json::Value_const*,cmJSONState*)> *
             )&local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::function<bool_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*,_cmJSONState_*)>::
  ~function(&local_50);
  Bind<(anonymous_namespace)::CMakeVersion,unsigned_int,std::function<bool(unsigned_int&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,unsigned_int(anonymous_namespace)::CMakeVersion::*,std::function<bool(unsigned_int&,Json::Value_const*,cmJSONState*)>,bool)
  ::{lambda((anonymous_namespace)::CMakeVersion&,Json::Value_const*,cmJSONState*)#1}::
  ~basic_string_view((_lambda__anonymous_namespace___CMakeVersion__Json__Value_const__cmJSONState___1_
                      *)&local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }